

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall
HighsLpRelaxation::HighsLpRelaxation(HighsLpRelaxation *this,HighsMipSolver *mipsolver)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_fffffffffffffe98;
  HighsInt in_stack_fffffffffffffe9c;
  HVectorBase<double> *in_stack_fffffffffffffea0;
  string *option;
  Highs *in_stack_fffffffffffffea8;
  Highs *this_00;
  Highs *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  *in_RDI = in_RSI;
  Highs::Highs(in_stack_ffffffffffffff40);
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::vector
            ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)0x603281
            );
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x60329a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6032b3);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6032cc);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6032e5);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x6032fe);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x603317);
  HVectorBase<double>::HVectorBase(in_stack_fffffffffffffea0);
  HighsSparseVectorSum::HighsSparseVectorSum((HighsSparseVectorSum *)in_stack_fffffffffffffea0);
  std::shared_ptr<const_HighsBasis>::shared_ptr((shared_ptr<const_HighsBasis> *)0x60336b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"output_flag",&local_31);
  Highs::setOptionValue
            (in_stack_fffffffffffffea8,(string *)in_stack_fffffffffffffea0,
             SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"random_seed",&local_69);
  Highs::setOptionValue
            (in_stack_fffffffffffffea8,(string *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c
            );
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"primal_feasibility_tolerance",&local_91);
  Highs::setOptionValue
            (in_stack_fffffffffffffea8,(string *)in_stack_fffffffffffffea0,
             (double)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  option = (string *)(in_RDI + 1);
  this_00 = (Highs *)&stack0xffffffffffffff47;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff48,"dual_feasibility_tolerance",(allocator *)this_00);
  Highs::setOptionValue
            (this_00,option,(double)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  *(undefined4 *)((long)in_RDI + 0x53ac) = 0;
  in_RDI[0xa70] = 0;
  in_RDI[0xa72] = 0;
  in_RDI[0xa73] = 0;
  in_RDI[0xa74] = 0;
  *(undefined4 *)(in_RDI + 0xa75) = 0;
  in_RDI[0xa71] = 0;
  in_RDI[0xa6c] = 0xfff0000000000000;
  *(undefined1 *)(in_RDI + 0xa6f) = 0;
  *(undefined1 *)(in_RDI + 0xa76) = 1;
  *(undefined4 *)(in_RDI + 0xa4e) = 0;
  return;
}

Assistant:

HighsLpRelaxation::HighsLpRelaxation(const HighsMipSolver& mipsolver)
    : mipsolver(mipsolver) {
  lpsolver.setOptionValue("output_flag", false);
  lpsolver.setOptionValue("random_seed", mipsolver.options_mip_->random_seed);
  lpsolver.setOptionValue("primal_feasibility_tolerance",
                          mipsolver.options_mip_->mip_feasibility_tolerance);
  lpsolver.setOptionValue(
      "dual_feasibility_tolerance",
      mipsolver.options_mip_->mip_feasibility_tolerance * 0.1);
  status = Status::kNotSet;
  numlpiters = 0;
  avgSolveIters = 0;
  numSolved = 0;
  epochs = 0;
  maxNumFractional = 0;
  lastAgeCall = 0;
  objective = -kHighsInf;
  currentbasisstored = false;
  adjustSymBranchingCol = true;
  row_ep.size = 0;
}